

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O1

void __thiscall
Transcript::AddGene(Transcript *this,string *name,int start,int stop,int rbs_start,int rbs_stop,
                   double rbs_strength)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Base_ptr *pp_Var2;
  long *plVar3;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  *this_00;
  size_type *psVar4;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
  __l;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
  __l_00;
  shared_ptr<ReleaseSite> stop_codon;
  shared_ptr<BindingSite> rbs;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  term;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  binding;
  int local_104;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  local_100;
  shared_ptr<BindingSite> local_d8;
  int local_c4;
  int local_c0;
  int local_bc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  _Base_ptr local_98;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  local_60;
  
  pp_Var2 = &local_90._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_c4 = rbs_stop;
  local_c0 = rbs_start;
  local_bc = stop;
  local_98 = (_Base_ptr)rbs_strength;
  local_90._M_impl._0_8_ = pp_Var2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"__ribosome","");
  local_90._M_impl.super__Rb_tree_header._M_header._M_right = local_98;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_90;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
         *)&local_60,__l,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &local_100,(allocator_type *)&local_b8);
  if ((_Base_ptr *)local_90._M_impl._0_8_ != pp_Var2) {
    operator_delete((void *)local_90._M_impl._0_8_);
  }
  paVar1 = &local_100.first.field_2;
  local_100.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"__ribosome","");
  local_100.second = 1.0;
  __l_00._M_len = 1;
  __l_00._M_array = &local_100;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
         *)&local_90,__l_00,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &local_b8,(allocator_type *)&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_100.first._M_dataplus._M_p);
  }
  std::operator+(&local_b8,"__",name);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_b8);
  psVar4 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_100.first.field_2._M_allocated_capacity = *psVar4;
    local_100.first.field_2._8_8_ = plVar3[3];
    local_100.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_100.first.field_2._M_allocated_capacity = *psVar4;
    local_100.first._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_100.first._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_d8.super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (BindingSite *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<BindingSite,std::allocator<BindingSite>,std::__cxx11::string,int&,int&,std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>&>
            (&local_d8.super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (BindingSite **)&local_d8,(allocator<BindingSite> *)&local_104,&local_100.first,
             &local_c0,&local_c4,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
              *)&local_60);
  std::__shared_ptr<BindingSite,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<BindingSite,BindingSite>
            ((__shared_ptr<BindingSite,(__gnu_cxx::_Lock_policy)2> *)&local_d8,
             local_d8.super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_100.first._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_b8._M_dataplus._M_p._4_4_,(int)local_b8._M_dataplus._M_p) !=
      &local_b8.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_b8._M_dataplus._M_p._4_4_,(int)local_b8._M_dataplus._M_p));
  }
  std::__cxx11::string::_M_assign
            ((string *)
             &((local_d8.super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_FixedElement).gene_);
  ((local_d8.super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_FixedElement
  ).reading_frame_ = start % 3;
  local_100.first._M_dataplus._M_p._0_4_ =
       ((local_d8.super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
       super_FixedElement).start_;
  local_b8._M_dataplus._M_p._0_4_ =
       ((local_d8.super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
       super_FixedElement).stop_;
  std::
  vector<Interval<std::shared_ptr<BindingSite>,unsigned_long>,std::allocator<Interval<std::shared_ptr<BindingSite>,unsigned_long>>>
  ::emplace_back<int,int,std::shared_ptr<BindingSite>&>
            ((vector<Interval<std::shared_ptr<BindingSite>,unsigned_long>,std::allocator<Interval<std::shared_ptr<BindingSite>,unsigned_long>>>
              *)&(this->super_Polymer).binding_intervals_,(int *)&local_100,(int *)&local_b8,
             &local_d8);
  std::operator+(&local_b8,"__",name);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_b8);
  psVar4 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_100.first.field_2._M_allocated_capacity = *psVar4;
    local_100.first.field_2._8_8_ = plVar3[3];
    local_100.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_100.first.field_2._M_allocated_capacity = *psVar4;
    local_100.first._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_100.first._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  this_00 = &std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>_>_>
             ::operator[](&this->bindings_,&local_100.first)->_M_t;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::operator=(this_00,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_100.first._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_b8._M_dataplus._M_p._4_4_,(int)local_b8._M_dataplus._M_p) !=
      &local_b8.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_b8._M_dataplus._M_p._4_4_,(int)local_b8._M_dataplus._M_p));
  }
  local_b8._M_dataplus._M_p._0_4_ = local_bc + -1;
  local_100.first._M_dataplus._M_p = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<ReleaseSite,std::allocator<ReleaseSite>,char_const(&)[11],int,int&,std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_100.first._M_string_length,
             (ReleaseSite **)&local_100,(allocator<ReleaseSite> *)&local_104,
             (char (*) [11])"stop_codon",(int *)&local_b8,&local_bc,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
              *)&local_90);
  std::__shared_ptr<ReleaseSite,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<ReleaseSite,ReleaseSite>
            ((__shared_ptr<ReleaseSite,(__gnu_cxx::_Lock_policy)2> *)&local_100,
             (ReleaseSite *)local_100.first._M_dataplus._M_p);
  *(int *)(local_100.first._M_dataplus._M_p + 0x98) = start % 3;
  std::__cxx11::string::_M_assign((string *)(local_100.first._M_dataplus._M_p + 0x70));
  local_b8._M_dataplus._M_p._0_4_ = *(int *)(local_100.first._M_dataplus._M_p + 0x38);
  local_104 = *(int *)(local_100.first._M_dataplus._M_p + 0x3c);
  std::
  vector<Interval<std::shared_ptr<ReleaseSite>,unsigned_long>,std::allocator<Interval<std::shared_ptr<ReleaseSite>,unsigned_long>>>
  ::emplace_back<int,int,std::shared_ptr<ReleaseSite>&>
            ((vector<Interval<std::shared_ptr<ReleaseSite>,unsigned_long>,std::allocator<Interval<std::shared_ptr<ReleaseSite>,unsigned_long>>>
              *)&(this->super_Polymer).release_intervals_,(int *)&local_b8,&local_104,
             (shared_ptr<ReleaseSite> *)&local_100);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100.first._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100.first._M_string_length);
  }
  if (local_d8.super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d8.super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::~_Rb_tree(&local_90);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void Transcript::AddGene(const std::string &name, int start, int stop,
                         int rbs_start, int rbs_stop, double rbs_strength) {
  auto binding = std::map<std::string, double>{{"__ribosome", rbs_strength}};
  auto term = std::map<std::string, double>{{"__ribosome", 1.0}};
  auto rbs = std::make_shared<BindingSite>("__" + name + "_rbs", rbs_start,
                                           rbs_stop, binding);
  rbs->gene(name);
  rbs->reading_frame(start % 3);
  binding_intervals_.emplace_back(rbs->start(), rbs->stop(), rbs);
  bindings_["__" + name + "_rbs"] = binding;
  auto stop_codon =
      std::make_shared<ReleaseSite>("stop_codon", stop - 1, stop, term);
  stop_codon->reading_frame(start % 3);
  stop_codon->gene(name);
  release_intervals_.emplace_back(stop_codon->start(), stop_codon->stop(),
                                  stop_codon);
}